

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::logDescription
          (OccludingGeometryComplexityCostCase *this)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  MessageBuilder local_6b8;
  MessageBuilder local_538;
  MessageBuilder local_3b8;
  MessageBuilder local_238;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  LogSection local_58;
  TestLog *local_18;
  TestLog *log;
  OccludingGeometryComplexityCostCase *this_local;
  
  log = (TestLog *)this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_RenderCountCase).super_BaseCase.super_TestCase.super_TestNode.
                       m_testCtx);
  local_18 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Description",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Test description",&local_b1);
  tcu::LogSection::LogSection(&local_58,&local_78,&local_b0);
  tcu::TestLog::operator<<(this_00,&local_58);
  tcu::LogSection::~LogSection(&local_58);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  tcu::TestLog::operator<<(&local_238,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_238,(char (*) [38])"Testing hidden fragment culling speed");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_238);
  tcu::TestLog::operator<<(&local_3b8,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_3b8,
                      (char (*) [152])
                      "Geometry consists of an occluding grid and an occluded fullsceen quad. The occluding geometry is rendered once, the occluded one is rendered repeatedly"
                     );
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3b8);
  tcu::TestLog::operator<<(&local_538,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_538,
                      (char (*) [69])
                      "Workload indicates the number of times the occluded quad is rendered");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_538);
  tcu::TestLog::operator<<(&local_6b8,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_6b8,
                      (char (*) [107])
                      "The time per culled pixel is estimated from the rate of change of rendering time as a function of workload"
                     );
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6b8);
  tcu::TestLog::operator<<(local_18,(EndSectionToken *)&tcu::TestLog::EndSection);
  return;
}

Assistant:

virtual void		logDescription		(void)
	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Section("Description", "Test description");
		log << TestLog::Message << "Testing hidden fragment culling speed" << TestLog::EndMessage;
		log << TestLog::Message << "Geometry consists of an occluding grid and an occluded fullsceen quad. The occluding geometry is rendered once, the occluded one is rendered repeatedly" << TestLog::EndMessage;
		log << TestLog::Message << "Workload indicates the number of times the occluded quad is rendered"  << TestLog::EndMessage;
		log << TestLog::Message << "The time per culled pixel is estimated from the rate of change of rendering time as a function of workload"  << TestLog::EndMessage;
		log << TestLog::EndSection;
	}